

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O3

int ply_close(p_ply ply)

{
  void *__ptr;
  size_t sVar1;
  long lVar2;
  p_ply_element __ptr_00;
  long lVar3;
  long lVar4;
  
  if ((ply->io_mode == PLY_WRITE) &&
     (sVar1 = fwrite(ply->buffer,1,ply->buffer_last,(FILE *)ply->fp), sVar1 < ply->buffer_last)) {
    ply_ferror(ply,"Error closing up");
    return 0;
  }
  if ((FILE *)ply->fp != (FILE *)0x0) {
    fclose((FILE *)ply->fp);
  }
  if (ply->gzfp != (gzFile)0x0) {
    gzclose();
  }
  __ptr_00 = ply->element;
  if (__ptr_00 != (p_ply_element)0x0) {
    lVar2 = ply->nelements;
    if (0 < lVar2) {
      lVar3 = 0x108;
      lVar4 = 0;
      do {
        __ptr = *(void **)(ply->element->name + lVar3);
        if (__ptr != (void *)0x0) {
          free(__ptr);
          lVar2 = ply->nelements;
        }
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + 0x118;
      } while (lVar4 < lVar2);
      __ptr_00 = ply->element;
    }
    free(__ptr_00);
  }
  if (ply->obj_info != (char *)0x0) {
    free(ply->obj_info);
  }
  if (ply->comment != (char *)0x0) {
    free(ply->comment);
  }
  free(ply);
  return 1;
}

Assistant:

int ply_close(p_ply ply) {
    long i;
    assert(ply && (ply->fp || ply->gzfp));
    assert(ply->element || ply->nelements == 0);
    assert(!ply->element || ply->nelements > 0);
    /* write last chunk to file */
    if (ply->io_mode == PLY_WRITE &&
        fwrite(ply->buffer, 1, ply->buffer_last, ply->fp) < ply->buffer_last) {
        ply_ferror(ply, "Error closing up");
        return 0;
    }
    if (ply->fp) fclose(ply->fp);
    if (ply->gzfp) gzclose(ply->gzfp);
    /* free all memory used by handle */
    if (ply->element) {
        for (i = 0; i < ply->nelements; i++) {
            p_ply_element element = &ply->element[i];
            if (element->property) free(element->property);
        }
        free(ply->element);
    }
    if (ply->obj_info) free(ply->obj_info);
    if (ply->comment) free(ply->comment);
    free(ply);
    return 1;
}